

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UaPdu.cpp
# Opt level: O0

void __thiscall DIS::UaPdu::marshal(UaPdu *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 local_88 [8];
  Vector3Float x_2;
  size_t idx_2;
  Vector3Float x_1;
  size_t idx_1;
  undefined1 local_38 [8];
  Vector3Float x;
  size_t idx;
  DataStream *dataStream_local;
  UaPdu *this_local;
  
  DistributedEmissionsFamilyPdu::marshal(&this->super_DistributedEmissionsFamilyPdu,dataStream);
  EntityID::marshal(&this->_emittingEntityID,dataStream);
  EventIdentifier::marshal(&this->_eventID,dataStream);
  DataStream::operator<<(dataStream,this->_stateChangeIndicator);
  DataStream::operator<<(dataStream,this->_pad);
  DataStream::operator<<(dataStream,this->_passiveParameterIndex);
  DataStream::operator<<(dataStream,this->_propulsionPlantConfiguration);
  sVar2 = std::vector<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>::size
                    (&this->_shaftRPMs);
  DataStream::operator<<(dataStream,(uchar)sVar2);
  sVar2 = std::vector<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>::size(&this->_apaData);
  DataStream::operator<<(dataStream,(uchar)sVar2);
  sVar2 = std::vector<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>::size
                    (&this->_emitterSystems);
  DataStream::operator<<(dataStream,(uchar)sVar2);
  x._z = 0.0;
  x._20_4_ = 0;
  while( true ) {
    uVar1 = x._16_8_;
    sVar2 = std::vector<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>::size
                      (&this->_shaftRPMs);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>::operator[]
                       (&this->_shaftRPMs,x._16_8_);
    Vector3Float::Vector3Float((Vector3Float *)local_38,pvVar3);
    Vector3Float::marshal((Vector3Float *)local_38,dataStream);
    Vector3Float::~Vector3Float((Vector3Float *)local_38);
    x._16_8_ = x._16_8_ + 1;
  }
  x_1._z = 0.0;
  x_1._20_4_ = 0;
  while( true ) {
    uVar1 = x_1._16_8_;
    sVar2 = std::vector<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>::size
                      (&this->_apaData);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>::operator[]
                       (&this->_apaData,x_1._16_8_);
    Vector3Float::Vector3Float((Vector3Float *)&idx_2,pvVar3);
    Vector3Float::marshal((Vector3Float *)&idx_2,dataStream);
    Vector3Float::~Vector3Float((Vector3Float *)&idx_2);
    x_1._16_8_ = x_1._16_8_ + 1;
  }
  x_2._z = 0.0;
  x_2._20_4_ = 0;
  while( true ) {
    uVar1 = x_2._16_8_;
    sVar2 = std::vector<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>::size
                      (&this->_emitterSystems);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>::operator[]
                       (&this->_emitterSystems,x_2._16_8_);
    Vector3Float::Vector3Float((Vector3Float *)local_88,pvVar3);
    Vector3Float::marshal((Vector3Float *)local_88,dataStream);
    Vector3Float::~Vector3Float((Vector3Float *)local_88);
    x_2._16_8_ = x_2._16_8_ + 1;
  }
  return;
}

Assistant:

void UaPdu::marshal(DataStream& dataStream) const
{
    DistributedEmissionsFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _emittingEntityID.marshal(dataStream);
    _eventID.marshal(dataStream);
    dataStream << _stateChangeIndicator;
    dataStream << _pad;
    dataStream << _passiveParameterIndex;
    dataStream << _propulsionPlantConfiguration;
    dataStream << ( unsigned char )_shaftRPMs.size();
    dataStream << ( unsigned char )_apaData.size();
    dataStream << ( unsigned char )_emitterSystems.size();

     for(size_t idx = 0; idx < _shaftRPMs.size(); idx++)
     {
        Vector3Float x = _shaftRPMs[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _apaData.size(); idx++)
     {
        Vector3Float x = _apaData[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _emitterSystems.size(); idx++)
     {
        Vector3Float x = _emitterSystems[idx];
        x.marshal(dataStream);
     }

}